

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O1

err_t rngESRead(size_t *read,void *buf,size_t count,char *source)

{
  ulong uVar1;
  u32 *puVar2;
  int iVar3;
  bool_t bVar4;
  long lVar5;
  undefined4 *puVar6;
  tm_ticks_t tVar7;
  FILE *__stream;
  size_t sVar8;
  code *pcVar9;
  undefined4 uVar10;
  long lVar11;
  err_t eVar12;
  ulong uVar13;
  int *piVar14;
  tm_ticks_t tVar15;
  char cVar16;
  octet ok;
  u32 local_58;
  u32 local_54;
  u32 local_50;
  u32 local_4c;
  size_t local_40;
  size_t *local_38;
  
  iVar3 = strCmp(source,"trng");
  if (iVar3 == 0) {
    puVar2 = (u32 *)cpuid_basic_info(0);
    local_58 = *puVar2;
    local_54 = puVar2[1];
    local_4c = puVar2[2];
    local_50 = puVar2[3];
    *read = 0;
    bVar4 = rngCPUIDIsManufId(&local_58,"GenuineIntel");
    if ((bVar4 == 0) && (bVar4 = rngCPUIDIsManufId(&local_58,"AuthenticAMD"), bVar4 == 0)) {
      return 0xca;
    }
    lVar11 = cpuid_Extended_Feature_Enumeration_info(7);
    if ((*(uint *)(lVar11 + 4) >> 0x12 & 1) == 0) {
      return 0xca;
    }
    if (count < 4) {
      return 0;
    }
    uVar1 = *read;
    uVar13 = uVar1 + 4;
    puVar6 = (undefined4 *)buf;
    while (uVar13 <= count) {
      uVar10 = rdseed();
      cVar16 = rdseedIsValid();
      *puVar6 = uVar10;
      if (cVar16 == '\0') goto LAB_00110b17;
      sVar8 = *read;
      uVar1 = sVar8 + 4;
      *read = uVar1;
      puVar6 = puVar6 + 1;
      uVar13 = sVar8 + 8;
    }
    if (count <= uVar1) {
      return 0;
    }
    uVar10 = rdseed();
    cVar16 = rdseedIsValid();
  }
  else {
    iVar3 = strCmp(source,"trng2");
    if (iVar3 != 0) {
      iVar3 = strCmp(source,"timer");
      local_40 = count;
      if (iVar3 == 0) {
        tVar7 = tmFreq();
        if (tVar7 < 1000000000) {
          return 0xca;
        }
        local_38 = read;
        if (count != 0) {
          sVar8 = 0;
          do {
            *(undefined1 *)((long)buf + sVar8) = 0;
            tVar7 = tmTicks();
            lVar11 = 0;
            do {
              lVar5 = 8;
              uVar13 = 0;
              tVar15 = tVar7;
              do {
                mtSleep(0);
                tVar7 = tmTicks();
                uVar13 = uVar13 ^ tVar7 - tVar15;
                lVar5 = lVar5 + -1;
                tVar15 = tVar7;
              } while (lVar5 != 0);
              bVar4 = u64Parity(uVar13);
              *(byte *)((long)buf + sVar8) =
                   *(byte *)((long)buf + sVar8) ^ (byte)(bVar4 << ((byte)lVar11 & 0x1f));
              lVar11 = lVar11 + 1;
            } while (lVar11 != 8);
            sVar8 = sVar8 + 1;
            count = local_40;
          } while (sVar8 != local_40);
        }
        *local_38 = count;
      }
      else {
        iVar3 = strCmp(source,"sys");
        if (iVar3 == 0) {
          __stream = (FILE *)fileOpen("/dev/urandom","rb");
          if (__stream == (FILE *)0x0) {
            return 0xcb;
          }
          sVar8 = fileRead2(buf,count,(file_t)__stream);
          *read = sVar8;
          fclose(__stream);
        }
        else {
          iVar3 = strCmp(source,"sys2");
          if (iVar3 != 0) {
            return 0xca;
          }
          piVar14 = &DAT_0013d374;
          lVar11 = 0;
          do {
            lVar5 = dlopen((long)&DAT_0013d374 + (long)*piVar14,2);
            sVar8 = local_40;
            if (lVar5 != 0) goto LAB_00110b28;
            lVar11 = lVar11 + 1;
            piVar14 = piVar14 + 1;
          } while (lVar11 != 4);
          lVar11 = 4;
          lVar5 = 0;
LAB_00110b28:
          if (lVar11 == 4) {
            return 0xca;
          }
          *read = 0;
          pcVar9 = (code *)dlsym(lVar5,"RAND_bytes");
          if ((pcVar9 == (code *)0x0) || (iVar3 = (*pcVar9)(buf,sVar8 & 0xffffffff), iVar3 != 1)) {
            dlclose(lVar5);
            return 0x70;
          }
          dlclose(lVar5);
          *read = sVar8;
        }
      }
      return 0;
    }
    puVar2 = (u32 *)cpuid_basic_info(0);
    local_58 = *puVar2;
    local_54 = puVar2[1];
    local_4c = puVar2[2];
    local_50 = puVar2[3];
    *read = 0;
    bVar4 = rngCPUIDIsManufId(&local_58,"GenuineIntel");
    if ((bVar4 == 0) && (bVar4 = rngCPUIDIsManufId(&local_58,"AuthenticAMD"), bVar4 == 0)) {
      return 0xca;
    }
    lVar11 = cpuid_Version_info(1);
    if ((*(uint *)(lVar11 + 0xc) >> 0x1e & 1) == 0) {
      return 0xca;
    }
    if (count < 4) {
      return 0;
    }
    uVar1 = *read;
    uVar13 = uVar1 + 4;
    puVar6 = (undefined4 *)buf;
    while (uVar13 <= count) {
      uVar10 = rdrand();
      cVar16 = rdrandIsValid();
      *puVar6 = uVar10;
      if (cVar16 == '\0') goto LAB_00110b17;
      sVar8 = *read;
      uVar1 = sVar8 + 4;
      *read = uVar1;
      puVar6 = puVar6 + 1;
      uVar13 = sVar8 + 8;
    }
    if (count <= uVar1) {
      return 0;
    }
    uVar10 = rdrand();
    cVar16 = rdrandIsValid();
  }
  eVar12 = 0;
  *(undefined4 *)((long)buf + (count - 4)) = uVar10;
  if (cVar16 == '\0') {
LAB_00110b17:
    eVar12 = 0x12e;
  }
  else {
    *read = count;
  }
  return eVar12;
}

Assistant:

err_t rngESRead(size_t* read, void* buf, size_t count, const char* source)
{
	if (strEq(source, "trng"))
		return rngTRNGRead(buf, read, count);
	else if (strEq(source, "trng2"))
		return rngTRNG2Read(buf, read, count);
	else if (strEq(source, "timer"))
		return rngTimerRead(buf, read, count);
	else if (strEq(source, "sys"))
		return rngSysRead(buf, read, count);
	else if (strEq(source, "sys2"))
		return rngSys2Read(buf, read, count);
	return ERR_FILE_NOT_FOUND;
}